

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmsio.c
# Opt level: O3

int FmsIOOpen(FmsIOContext *ctx,char *filename,char *mode)

{
  FILE *pFVar1;
  
  if (ctx == (FmsIOContext *)0x0) {
    return 1;
  }
  if (filename != (char *)0x0) {
    if (mode != (char *)0x0) {
      pFVar1 = fopen(filename,mode);
      ctx->fp = (FILE *)pFVar1;
      return (uint)(pFVar1 == (FILE *)0x0) << 2;
    }
    return 3;
  }
  return 2;
}

Assistant:

static int
FmsIOOpen(FmsIOContext *ctx, const char *filename, const char *mode) {
  if(!ctx) E_RETURN(1);
  if(!filename) E_RETURN(2);
  if(!mode) E_RETURN(3);
  ctx->fp = fopen(filename, mode);
  if(!ctx->fp) E_RETURN(4);
  return 0;
}